

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong uVar1;
  ulong *puVar2;
  mbedtls_mpi_uint *pmVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  byte c;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char cVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint local_80;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [5];
  
  C.s = 1;
  C.n = 5;
  C.p = Cp;
  Cp[0] = 0;
  Cp[1] = 0;
  Cp[2] = 0;
  Cp[3] = 0;
  Cp[4] = 0;
  iVar5 = mbedtls_mpi_grow(N,8);
  if (iVar5 == 0) {
    pmVar3 = N->p;
    uVar20 = pmVar3[4];
    uVar4 = (uint)uVar20;
    uVar13 = (uint)*pmVar3;
    uVar21 = uVar4 + uVar13;
    uVar11 = (uint)(uVar20 >> 0x20);
    uVar22 = uVar21 + uVar11;
    uVar6 = (uint)(pmVar3[5] >> 0x20);
    uVar23 = uVar22 - uVar6;
    uVar8 = (uint)pmVar3[6];
    uVar24 = uVar23 - uVar8;
    uVar10 = (uint)(pmVar3[6] >> 0x20);
    uVar25 = uVar24 - uVar10;
    uVar12 = (uint)pmVar3[7];
    cVar14 = ((((CARRY4(uVar21,uVar11) + CARRY4(uVar4,uVar13)) - (uVar22 < uVar6)) -
              (uVar23 < uVar8)) - (uVar24 < uVar10)) - (uVar25 < uVar12);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)(*pmVar3 >> 0x20);
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + uVar11;
    local_80 = (uint)pmVar3[5];
    uVar24 = uVar23 + local_80;
    uVar15 = uVar24 - uVar8;
    uVar16 = uVar15 - uVar10;
    uVar17 = uVar16 - uVar12;
    uVar22 = (uint)(pmVar3[7] >> 0x20);
    cVar14 = ((((CARRY4(uVar21 + uVar13,uVar11) + cVar14 + CARRY4(uVar23,local_80)) -
               (uVar24 < uVar8)) - (uVar15 < uVar10)) - (uVar16 < uVar12)) - (uVar17 < uVar22);
    *pmVar3 = CONCAT44(uVar17 - uVar22,uVar25 - uVar12);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)pmVar3[1];
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + local_80;
    uVar24 = uVar23 + uVar6;
    uVar25 = uVar24 - uVar10;
    uVar15 = uVar25 - uVar12;
    cVar14 = (((CARRY4(uVar21 + uVar13,local_80) + cVar14 + CARRY4(uVar23,uVar6)) -
              (uVar24 < uVar10)) - (uVar25 < uVar12)) - (uVar15 < uVar22);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)(pmVar3[1] >> 0x20);
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + uVar6;
    uVar24 = uVar23 + uVar6;
    uVar25 = uVar24 + uVar8;
    uVar16 = uVar25 + uVar8;
    uVar17 = uVar16 + uVar10;
    uVar18 = uVar17 - uVar22;
    uVar19 = uVar18 - uVar4;
    cVar14 = (((CARRY4(uVar25,uVar8) +
                CARRY4(uVar23,uVar6) + cVar14 + CARRY4(uVar21 + uVar13,uVar6) + CARRY4(uVar24,uVar8)
               + CARRY4(uVar16,uVar10)) - (uVar17 < uVar22)) - (uVar18 < uVar4)) - (uVar19 < uVar11)
    ;
    pmVar3[1] = CONCAT44(uVar19 - uVar11,uVar15 - uVar22);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)pmVar3[2];
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + uVar8;
    uVar24 = uVar23 + uVar8;
    uVar25 = uVar24 + uVar10;
    uVar15 = uVar25 + uVar10;
    uVar16 = uVar15 + uVar12;
    uVar17 = uVar16 - uVar11;
    cVar14 = ((CARRY4(uVar25,uVar10) +
               CARRY4(uVar23,uVar8) + cVar14 + CARRY4(uVar21 + uVar13,uVar8) + CARRY4(uVar24,uVar10)
              + CARRY4(uVar15,uVar12)) - (uVar16 < uVar11)) - (uVar17 < local_80);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)(pmVar3[2] >> 0x20);
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + uVar10;
    uVar24 = uVar23 + uVar10;
    uVar25 = uVar24 + uVar12;
    uVar15 = uVar25 + uVar12;
    uVar16 = uVar15 + uVar22;
    uVar18 = uVar16 - local_80;
    cVar14 = ((CARRY4(uVar25,uVar12) +
               CARRY4(uVar23,uVar10) + cVar14 + CARRY4(uVar21 + uVar13,uVar10) +
               CARRY4(uVar24,uVar12) + CARRY4(uVar15,uVar22)) - (uVar16 < local_80)) -
             (uVar18 < uVar6);
    pmVar3[2] = CONCAT44(uVar18 - uVar6,uVar17 - local_80);
    uVar21 = (uint)cVar14;
    uVar13 = (uint)pmVar3[3];
    if (cVar14 < '\0') {
      cVar14 = -(uVar13 < -uVar21);
    }
    else {
      cVar14 = CARRY4(uVar21,uVar13);
    }
    uVar23 = uVar21 + uVar13 + uVar12;
    uVar24 = uVar23 + uVar12;
    uVar25 = uVar24 + uVar22;
    uVar15 = uVar25 + uVar22;
    uVar16 = uVar15 + uVar12;
    uVar17 = uVar16 + uVar10;
    uVar18 = uVar17 - uVar4;
    cVar14 = ((CARRY4(uVar15,uVar12) +
               CARRY4(uVar24,uVar22) +
               CARRY4(uVar21 + uVar13,uVar12) + cVar14 + CARRY4(uVar23,uVar12) +
               CARRY4(uVar25,uVar22) + CARRY4(uVar16,uVar10)) - (uVar17 < uVar4)) -
             (uVar18 < uVar11);
    uVar13 = (uint)cVar14;
    uVar12 = (uint)(pmVar3[3] >> 0x20);
    if (cVar14 < '\0') {
      cVar14 = -(uVar12 < -uVar13);
    }
    else {
      cVar14 = CARRY4(uVar13,uVar12);
    }
    uVar21 = uVar13 + uVar12 + uVar22;
    uVar23 = uVar21 + uVar22;
    uVar24 = uVar23 + uVar22;
    uVar25 = uVar24 + uVar4;
    uVar15 = uVar25 - local_80;
    uVar16 = uVar15 - uVar6;
    uVar17 = uVar16 - uVar8;
    c = ((((CARRY4(uVar23,uVar22) + CARRY4(uVar13 + uVar12,uVar22) + cVar14 + CARRY4(uVar21,uVar22)
           + CARRY4(uVar24,uVar4)) - (uVar25 < local_80)) - (uVar15 < uVar6)) - (uVar16 < uVar8)) -
        (uVar17 < uVar10);
    pmVar3[3] = CONCAT44(uVar17 - uVar10,uVar18 - uVar11);
    bVar7 = 0;
    if ('\0' < (char)c) {
      bVar7 = c;
    }
    pmVar3[4] = (ulong)bVar7 | uVar20 & 0xffffffff00000000;
    uVar20 = 8;
    while (uVar1 = uVar20 + 1, uVar1 < N->n * 2) {
      uVar9 = 0xffffffff00000000;
      if ((uVar20 & 1) == 0) {
        uVar9 = 0xffffffff;
      }
      puVar2 = (ulong *)((long)pmVar3 + (uVar1 & 0xfffffffffffffffe) * 4);
      *puVar2 = *puVar2 & uVar9;
      uVar20 = uVar1;
    }
    if ((char)c < '\0') {
      fix_negative(N,c,&C,0x100);
    }
  }
  return iVar5;
}

Assistant:

static int ecp_mod_p256( mbedtls_mpi *N )
{
    INIT( 256 );

    ADD(  8 ); ADD(  9 );
    SUB( 11 ); SUB( 12 ); SUB( 13 ); SUB( 14 );             NEXT; // A0

    ADD(  9 ); ADD( 10 );
    SUB( 12 ); SUB( 13 ); SUB( 14 ); SUB( 15 );             NEXT; // A1

    ADD( 10 ); ADD( 11 );
    SUB( 13 ); SUB( 14 ); SUB( 15 );                        NEXT; // A2

    ADD( 11 ); ADD( 11 ); ADD( 12 ); ADD( 12 ); ADD( 13 );
    SUB( 15 ); SUB(  8 ); SUB(  9 );                        NEXT; // A3

    ADD( 12 ); ADD( 12 ); ADD( 13 ); ADD( 13 ); ADD( 14 );
    SUB(  9 ); SUB( 10 );                                   NEXT; // A4

    ADD( 13 ); ADD( 13 ); ADD( 14 ); ADD( 14 ); ADD( 15 );
    SUB( 10 ); SUB( 11 );                                   NEXT; // A5

    ADD( 14 ); ADD( 14 ); ADD( 15 ); ADD( 15 ); ADD( 14 ); ADD( 13 );
    SUB(  8 ); SUB(  9 );                                   NEXT; // A6

    ADD( 15 ); ADD( 15 ); ADD( 15 ); ADD( 8 );
    SUB( 10 ); SUB( 11 ); SUB( 12 ); SUB( 13 );             LAST; // A7

cleanup:
    return( ret );
}